

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O3

int test_assert_multiple(ITesting *t)

{
  kTRContinueMode kVar1;
  ITestingConfig *trConfig;
  void *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_50 = (void *)0x0;
  (*t->QueryInterface)(0xc07f19,&local_50);
  if ((local_50 != (void *)0x0) ||
     (kVar1 = (*t->AssertError)(0x21,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                ,"trConfig != nullptr"), kVar1 != kTRLeave)) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)((long)local_50 + 8))("continue_on_assert",&local_48);
    if (((char)local_48 == '\x01') && ((local_28._4_4_ == 0 && ((int)uStack_20 == 1)))) {
      kVar1 = (*t->AssertError)(0x27,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                ,"1==2");
      if (kVar1 != kTRLeave) {
        kVar1 = (*t->AssertError)(0x28,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                  ,"true==false");
        return (uint)(kVar1 == kTRLeave) << 4;
      }
    }
    else {
      (*t->Error)(0x25,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                  ,"\"Must run with \'continue on assert\' enabled!\"");
    }
  }
  return 0x10;
}

Assistant:

DLL_EXPORT int test_assert_multiple(ITesting *t) {
    // t->SetDescription("Check if multiple assert values are allowed");

    ITestingConfig *trConfig = {};
    t->QueryInterface(ITestingConfig_IFace_ID, (void **)&trConfig);
    TR_ASSERT(t, trConfig != nullptr);
    TRUN_ConfigItem continueOnAssert = {};
    trConfig->Get("continue_on_assert", &continueOnAssert);
    // Verify - this is not an error..
    TR_REQUIRE(t, (continueOnAssert.isValid) && (continueOnAssert.value_type == kTRCfgType_Bool) && (continueOnAssert.value.boolean == true), "Must run with 'continue on assert' enabled!");

    TR_ASSERT(t, 1==2);
    TR_ASSERT(t, true==false);
    return kTR_Pass;
}